

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_settable_totop(lua_State *L,CallInfo *ci,TValue *ra,TValue *first_val,int start)

{
  LuaType LVar1;
  Table *t;
  RaviArray *t_00;
  int iVar2;
  lua_Integer in_RAX;
  lua_Integer value;
  uint nasize;
  char *pcVar3;
  TValue *pTVar4;
  uint ukey;
  ulong uVar5;
  ulong uVar6;
  lua_Number value_00;
  lua_Integer i;
  lua_Integer local_38;
  
  LVar1 = ra->tt_;
  uVar5 = (ulong)((long)L->top - (long)first_val) >> 4;
  if ((LVar1 == 0x8025) || (LVar1 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar3 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_00131736;
    }
    uVar6 = (ulong)start;
    pTVar4 = first_val + (uVar6 - 1);
    local_38 = in_RAX;
    for (; (long)uVar6 < (long)((int)uVar5 + start); uVar6 = uVar6 + 1) {
      LVar1 = pTVar4->tt_;
      if ((t_00->flags & 8) == 0) {
        if (LVar1 == 0x13) {
          value = (pTVar4->value_).i;
        }
        else {
          local_38 = 0;
          iVar2 = luaV_tointegerns(pTVar4,&local_38,F2Ieq);
          value = local_38;
          if (iVar2 == 0) {
            pcVar3 = "value cannot be converted to integer";
LAB_001316fd:
            luaG_runerror(L,pcVar3);
          }
        }
        if ((uint)uVar6 < t_00->len) {
          *(lua_Integer *)(t_00->data + (uVar6 & 0xffffffff) * 8) = value;
        }
        else {
          raviH_set_int(L,t_00,uVar6 & 0xffffffff,value);
        }
      }
      else {
        if (LVar1 == 0x13) {
          value_00 = (lua_Number)(pTVar4->value_).i;
        }
        else {
          if (LVar1 != 3) {
            pcVar3 = "value cannot be converted to number";
            goto LAB_001316fd;
          }
          value_00 = (pTVar4->value_).n;
        }
        if ((uint)uVar6 < t_00->len) {
          *(lua_Number *)(t_00->data + (uVar6 & 0xffffffff) * 8) = value_00;
        }
        else {
          raviH_set_float(L,t_00,uVar6 & 0xffffffff,value_00);
        }
      }
      pTVar4 = pTVar4 + 1;
    }
  }
  else {
    if (LVar1 != 0x8005) {
      pcVar3 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_00131736:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb43,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb39,
                    "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                   );
    }
    nasize = (int)uVar5 + -1 + start;
    if (t->sizearray < nasize) {
      luaH_resizearray(L,t,nasize);
    }
    pTVar4 = first_val + ((uVar5 & 0xffffffff) - 1);
    while (iVar2 = (int)uVar5, 0 < iVar2) {
      luaH_setint(L,t,(ulong)(uint)(start + -1 + iVar2),pTVar4);
      if ((short)pTVar4->tt_ < 0) {
        if (9 < (t->tt & 0xe)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb3f,
                        "void raviV_op_settable_totop(lua_State *, CallInfo *, TValue *, TValue *, int)"
                       );
        }
        if (((t->marked & 0x20) != 0) && ((((pTVar4->value_).gc)->marked & 0x18) != 0)) {
          luaC_barrierback_(L,(GCObject *)t);
        }
      }
      pTVar4 = pTVar4 + -1;
      uVar5 = (ulong)(iVar2 - 1);
    }
  }
  return;
}

Assistant:

void raviV_op_settable_totop(lua_State *L, CallInfo *ci, TValue *ra, TValue *first_val, int start) {
  unsigned int last;
  int n = cast_int(L->top - first_val);
  last = start + n - 1;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = first_val + n - 1;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = start;
    for (; i <= (int)last; i++) {
      TValue *val = first_val + i - 1;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  //L->top = ci->top; /* correct top (in case of previous open call) */
}